

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

SerialArena * google::protobuf::internal::SerialArena::New(Block *b,void *owner,ArenaImpl *arena)

{
  size_t sVar1;
  SerialArena *pSVar2;
  char *pcVar3;
  ArenaImpl *in_RDX;
  void *in_RSI;
  Block *in_RDI;
  SerialArena *serial;
  size_t pos;
  size_t in_stack_ffffffffffffffb8;
  Block *in_stack_ffffffffffffffc0;
  
  sVar1 = Block::pos(in_RDI);
  pSVar2 = (SerialArena *)Block::Pointer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Block::set_pos(in_RDI,sVar1 + 0x48);
  pSVar2->arena_ = in_RDX;
  pSVar2->owner_ = in_RSI;
  pSVar2->head_ = in_RDI;
  Block::pos(in_RDI);
  pcVar3 = Block::Pointer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pSVar2->ptr_ = pcVar3;
  Block::size(in_RDI);
  pcVar3 = Block::Pointer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pSVar2->limit_ = pcVar3;
  pSVar2->cleanup_ = (CleanupChunk *)0x0;
  pSVar2->cleanup_ptr_ = (CleanupNode *)0x0;
  pSVar2->cleanup_limit_ = (CleanupNode *)0x0;
  return pSVar2;
}

Assistant:

SerialArena* SerialArena::New(Block* b, void* owner, ArenaImpl* arena) {
  auto pos = b->pos();
  GOOGLE_DCHECK_LE(pos + ArenaImpl::kSerialArenaSize, b->size());
  SerialArena* serial = reinterpret_cast<SerialArena*>(b->Pointer(pos));
  b->set_pos(pos + ArenaImpl::kSerialArenaSize);
  serial->arena_ = arena;
  serial->owner_ = owner;
  serial->head_ = b;
  serial->ptr_ = b->Pointer(b->pos());
  serial->limit_ = b->Pointer(b->size());
  serial->cleanup_ = NULL;
  serial->cleanup_ptr_ = NULL;
  serial->cleanup_limit_ = NULL;
  return serial;
}